

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
SupportVertexCallback::processTriangle
          (SupportVertexCallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  cbtVector3 *v;
  undefined8 uVar1;
  long lVar2;
  cbtScalar cVar3;
  
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x10) {
    v = (cbtVector3 *)((long)triangle->m_floats + lVar2);
    cVar3 = cbtVector3::dot(&this->m_supportVecLocal,v);
    if (this->m_maxDot < cVar3) {
      this->m_maxDot = cVar3;
      uVar1 = *(undefined8 *)(v->m_floats + 2);
      *(undefined8 *)(this->m_supportVertexLocal).m_floats = *(undefined8 *)v->m_floats;
      *(undefined8 *)((this->m_supportVertexLocal).m_floats + 2) = uVar1;
    }
  }
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		(void)partId;
		(void)triangleIndex;
		for (int i = 0; i < 3; i++)
		{
			cbtScalar dot = m_supportVecLocal.dot(triangle[i]);
			if (dot > m_maxDot)
			{
				m_maxDot = dot;
				m_supportVertexLocal = triangle[i];
			}
		}
	}